

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O0

void parseACTFile(filebuf *file)

{
  undefined8 uVar1;
  pointer pvVar2;
  reference bytes;
  reference this;
  value_type local_34c;
  reference local_348;
  Rgba *color;
  ulong uStack_338;
  uint16_t i;
  size_t colorIdx;
  char *ptr;
  long lStack_320;
  uint16_t nbColors;
  streamsize len;
  array<char,_772UL> buf;
  filebuf *file_local;
  
  buf._M_elems._764_8_ = file;
  memset((void *)((long)&len + 4),0,0x304);
  uVar1 = buf._M_elems._764_8_;
  pvVar2 = std::array<char,_772UL>::data((array<char,_772UL> *)((long)&len + 4));
  std::array<char,_772UL>::size((array<char,_772UL> *)((long)&len + 4));
  lStack_320 = std::streambuf::sgetn((char *)uVar1,(long)pvVar2);
  ptr._6_2_ = 0x100;
  if (lStack_320 == 0x304) {
    bytes = std::array<char,_772UL>::operator[]((array<char,_772UL> *)((long)&len + 4),0x300);
    ptr._6_2_ = readBE<unsigned_short,char>(bytes);
    if ((0x100 < ptr._6_2_) || (ptr._6_2_ == 0)) {
      error("Invalid number of colors in ACT file (%u)",(ulong)ptr._6_2_);
      return;
    }
  }
  else if (lStack_320 != 0x300) {
    error("Invalid file size for ACT file (expected 768 or 772 bytes, got %zu",lStack_320);
    return;
  }
  if ((ushort)((ushort)options.nbColorsPerPal * (ushort)options.nbPalettes) < ptr._6_2_) {
    warning("ACT file contains %u colors, but there can only be %u; ignoring extra",(ulong)ptr._6_2_
            ,(ulong)((uint)options.nbColorsPerPal * (uint)options.nbPalettes));
    ptr._6_2_ = (ushort)options.nbColorsPerPal * (ushort)options.nbPalettes;
  }
  std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::clear
            (&options.palSpec);
  std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::emplace_back<>
            (&options.palSpec);
  colorIdx = (size_t)std::array<char,_772UL>::data((array<char,_772UL> *)((long)&len + 4));
  uStack_338 = 0;
  for (color._6_2_ = 0; color._6_2_ < ptr._6_2_; color._6_2_ = color._6_2_ + 1) {
    this = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::back
                     (&options.palSpec);
    local_348 = std::array<Rgba,_4UL>::operator[](this,uStack_338);
    Rgba::Rgba(&local_34c,*(uint8_t *)colorIdx,*(uint8_t *)(colorIdx + 1),*(uint8_t *)(colorIdx + 2)
               ,0xff);
    *local_348 = local_34c;
    colorIdx = colorIdx + 3;
    uStack_338 = uStack_338 + 1;
    if (uStack_338 == options.nbColorsPerPal) {
      std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::emplace_back<>
                (&options.palSpec);
      uStack_338 = 0;
    }
  }
  if (uStack_338 == 0) {
    std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::pop_back
              (&options.palSpec);
  }
  return;
}

Assistant:

static void parseACTFile(std::filebuf &file) {
	// https://www.adobe.com/devnet-apps/photoshop/fileformatashtml/#50577411_pgfId-1070626

	std::array<char, 772> buf{};
	auto len = file.sgetn(buf.data(), buf.size());

	uint16_t nbColors = 256;
	if (len == 772) {
		nbColors = readBE<uint16_t>(&buf[768]);
		// TODO: apparently there is a "transparent color index"? What?
		if (nbColors > 256 || nbColors == 0) {
			error("Invalid number of colors in ACT file (%" PRIu16 ")", nbColors);
			return;
		}
	} else if (len != 768) {
		error("Invalid file size for ACT file (expected 768 or 772 bytes, got %zu", len);
		return;
	}

	if (nbColors > options.nbColorsPerPal * options.nbPalettes) {
		warning("ACT file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, options.nbColorsPerPal * options.nbPalettes);
		nbColors = options.nbColorsPerPal * options.nbPalettes;
	}

	options.palSpec.clear();
	options.palSpec.emplace_back();

	char const *ptr = buf.data();
	size_t colorIdx = 0;
	for (uint16_t i = 0; i < nbColors; ++i) {
		Rgba &color = options.palSpec.back()[colorIdx];
		color = Rgba(ptr[0], ptr[1], ptr[2], 0xFF);

		ptr += 3;
		++colorIdx;
		if (colorIdx == options.nbColorsPerPal) {
			options.palSpec.emplace_back();
			colorIdx = 0;
		}
	}

	// Remove the spurious empty palette if there is one
	if (colorIdx == 0) {
		options.palSpec.pop_back();
	}
}